

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

ArrayBuilder<capnp::JsonCodec::AnnotatedHandler::FlattenedField> * __thiscall
kj::ArrayBuilder<capnp::JsonCodec::AnnotatedHandler::FlattenedField>::operator=
          (ArrayBuilder<capnp::JsonCodec::AnnotatedHandler::FlattenedField> *this,
          ArrayBuilder<capnp::JsonCodec::AnnotatedHandler::FlattenedField> *other)

{
  FlattenedField *pFVar1;
  RemoveConst<capnp::JsonCodec::AnnotatedHandler::FlattenedField> *pRVar2;
  FlattenedField *pFVar3;
  
  pFVar1 = this->ptr;
  if (pFVar1 != (FlattenedField *)0x0) {
    pRVar2 = this->pos;
    pFVar3 = this->endPtr;
    this->ptr = (FlattenedField *)0x0;
    this->pos = (RemoveConst<capnp::JsonCodec::AnnotatedHandler::FlattenedField> *)0x0;
    this->endPtr = (FlattenedField *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pFVar1,0xb8,((long)pRVar2 - (long)pFVar1 >> 3) * -0x2c8590b21642c859,
               ((long)pFVar3 - (long)pFVar1 >> 3) * -0x2c8590b21642c859,
               ArrayDisposer::Dispose_<capnp::JsonCodec::AnnotatedHandler::FlattenedField,_false>::
               destruct);
  }
  this->ptr = other->ptr;
  this->pos = other->pos;
  this->endPtr = other->endPtr;
  this->disposer = other->disposer;
  other->ptr = (FlattenedField *)0x0;
  other->pos = (RemoveConst<capnp::JsonCodec::AnnotatedHandler::FlattenedField> *)0x0;
  other->endPtr = (FlattenedField *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }